

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
ModbusSimulationDataGenerator::SendGenDiagnosticRequest
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U8 FuncCode)

{
  ushort uVar1;
  byte bVar2;
  uint uVar3;
  ModbusSimulationDataGenerator *pMVar4;
  ModbusSimulationDataGenerator *this_00;
  U64 value;
  
  if (this->mSettings->mModbusMode == ModbusRTUClient) {
    CreateModbusByte(this,(ulong)DeviceID);
    uVar3 = (int)this + 0x30;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar3);
    CreateModbusByte(this,(ulong)FuncCode);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar3);
    uVar1 = this->crc_tab16[(byte)~((byte)this->crc_tab16[(byte)~DeviceID] ^ FuncCode)];
    CreateModbusByte(this,(ulong)(ushort)(this->crc_tab16[(byte)~DeviceID] >> 8 ^ uVar1) & 0xff);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar3);
    value = (U64)(uVar1 >> 8);
  }
  else {
    CreateModbusByte(this,0x3a);
    this_00 = (ModbusSimulationDataGenerator *)&this->mModbusSimulationData;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    uVar3 = (uint)this_00;
    pMVar4 = this_00;
    SimulationChannelDescriptor::Advance(uVar3);
    bVar2 = BinToLATIN1(pMVar4,DeviceID >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar4 = this_00;
    SimulationChannelDescriptor::Advance(uVar3);
    bVar2 = BinToLATIN1(pMVar4,DeviceID & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar4 = this_00;
    SimulationChannelDescriptor::Advance(uVar3);
    bVar2 = BinToLATIN1(pMVar4,FuncCode >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar4 = this_00;
    SimulationChannelDescriptor::Advance(uVar3);
    bVar2 = BinToLATIN1(pMVar4,FuncCode & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar4 = this_00;
    SimulationChannelDescriptor::Advance(uVar3);
    bVar2 = BinToLATIN1(pMVar4,(byte)-(FuncCode + DeviceID) >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar3);
    bVar2 = BinToLATIN1(this_00,-(FuncCode + DeviceID) & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar3);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar3);
    value = 10;
  }
  CreateModbusByte(this,value);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance((int)this + 0x30);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendGenDiagnosticRequest( U8 DeviceID, U8 FuncCode )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUClient )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( FuncCode );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, FuncCode );

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + FuncCode;

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( FuncCode >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( FuncCode & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}